

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  ArrayIndex index;
  Value *pVVar1;
  Value *value_local;
  Value *this_local;
  
  index = size(this);
  pVVar1 = operator[](this,index);
  pVVar1 = operator=(pVVar1,value);
  return pVVar1;
}

Assistant:

Value &
Value::append( const Value &value )
{
   return (*this)[size()] = value;
}